

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

ALLEGRO_BITMAP * al_clone_bitmap(ALLEGRO_BITMAP *bitmap)

{
  uint format;
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int mul;
  int mul_00;
  int val;
  int val_00;
  ALLEGRO_BITMAP *bitmap_00;
  ALLEGRO_BITMAP *pAVar4;
  ALLEGRO_LOCKED_REGION *pAVar5;
  ALLEGRO_LOCKED_REGION *pAVar6;
  ALLEGRO_LOCKED_REGION *pAVar7;
  uint format_00;
  ALLEGRO_BITMAP *in_stack_ffffffffffffffb8;
  
  bitmap_00 = al_create_bitmap(bitmap->w,bitmap->h);
  if (bitmap_00 != (ALLEGRO_BITMAP *)0x0) {
    pAVar4 = bitmap->parent;
    if (bitmap->parent == (ALLEGRO_BITMAP *)0x0) {
      pAVar4 = bitmap;
    }
    format_00 = pAVar4->_format;
    pAVar4 = bitmap_00->parent;
    if (bitmap_00->parent == (ALLEGRO_BITMAP *)0x0) {
      pAVar4 = bitmap_00;
    }
    format = pAVar4->_format;
    pAVar6 = (ALLEGRO_LOCKED_REGION *)(ulong)format;
    _Var2 = _al_pixel_format_is_compressed(format_00);
    _Var3 = _al_pixel_format_is_compressed(format);
    val = bitmap->w;
    val_00 = bitmap->h;
    if (((_Var2) && (_Var3)) && (format_00 == format)) {
      mul = al_get_pixel_block_width(format_00);
      mul_00 = al_get_pixel_block_height(format_00);
      pAVar5 = al_lock_bitmap_blocked(bitmap,1);
      if (pAVar5 == (ALLEGRO_LOCKED_REGION *)0x0) {
        bVar1 = false;
      }
      else {
        pAVar6 = al_lock_bitmap_blocked(bitmap_00,2);
        if (pAVar6 == (ALLEGRO_LOCKED_REGION *)0x0) {
          al_unlock_bitmap(bitmap);
          pAVar6 = (ALLEGRO_LOCKED_REGION *)0x0;
          bVar1 = false;
        }
        else {
          val = _al_get_least_multiple(val,mul);
          val_00 = _al_get_least_multiple(val_00,mul_00);
          _Var2 = _al_trace_prefix("bitmap",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                                   ,0x2ae,"transfer_bitmap_data");
          bVar1 = true;
          if (_Var2) {
            _al_trace_suffix("Taking fast clone path.\n");
          }
        }
      }
      if (bVar1) {
LAB_00141e23:
        _al_convert_bitmap_data
                  (pAVar5->data,pAVar5->format,pAVar5->pitch,pAVar6->data,pAVar6->format,
                   pAVar6->pitch,0,0,0,0,val,val_00);
        al_unlock_bitmap(bitmap);
        al_unlock_bitmap(bitmap_00);
        return bitmap_00;
      }
    }
    else {
      pAVar7 = (ALLEGRO_LOCKED_REGION *)0x0;
      pAVar5 = pAVar7;
      if (!_Var3) {
        format_00 = 0;
        pAVar5 = pAVar6;
      }
      pAVar6 = pAVar5;
      if (!_Var2) {
        pAVar6 = (ALLEGRO_LOCKED_REGION *)(ulong)format_00;
      }
      pAVar5 = al_lock_bitmap(bitmap,(int)pAVar6,1);
      if (pAVar5 != (ALLEGRO_LOCKED_REGION *)0x0) {
        pAVar6 = al_lock_bitmap(bitmap_00,(int)pAVar6,2);
        if (pAVar6 == (ALLEGRO_LOCKED_REGION *)0x0) {
          al_unlock_bitmap(bitmap);
          pAVar6 = (ALLEGRO_LOCKED_REGION *)0x0;
          pAVar7 = (ALLEGRO_LOCKED_REGION *)0x0;
        }
        else {
          pAVar7 = (ALLEGRO_LOCKED_REGION *)0x1;
        }
      }
      if ((char)pAVar7 != '\0') goto LAB_00141e23;
    }
    al_destroy_bitmap(in_stack_ffffffffffffffb8);
  }
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *al_clone_bitmap(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_BITMAP *clone;
   ASSERT(bitmap);

   clone = al_create_bitmap(bitmap->w, bitmap->h);
   if (!clone)
      return NULL;
   if (!transfer_bitmap_data(bitmap, clone)) {
      al_destroy_bitmap(clone);
      return NULL;
   }
   return clone;
}